

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O1

bool __thiscall
coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>::checkin
          (ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> *this,
          Func *func,void *ctx)

{
  void *local_8;
  
  local_8 = ctx;
  asio::detail::
  initiate_dispatch_with_executor<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>::
  operator()((initiate_dispatch_with_executor<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>
              *)&local_8,func,(type *)0x0,(type *)0x0);
  return true;
}

Assistant:

virtual bool checkin(Func func, void *ctx) override {
    using context_t = std::remove_cvref_t<decltype(executor_.context())>;
    auto &executor = *(context_t *)ctx;
    if constexpr (requires(ExecutorImpl e) { e.post(std::move(func)); }) {
      executor.post(std::move(func));
    }
    else {
      asio::dispatch(executor, std::move(func));
    }
    return true;
  }